

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadrule.cpp
# Opt level: O0

void radau_compute(int n,double *x,double *w)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ostream *poVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  double dVar7;
  double dVar8;
  bool local_61;
  double *xold;
  double tolerance;
  double test;
  double temp;
  double r8_pi;
  double *p;
  int j;
  int iterate_max;
  int iterate;
  int i;
  double *w_local;
  double *x_local;
  int n_local;
  
  if (n < 1) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"RADAU_COMPUTE - Fatal error!\n");
    poVar3 = std::operator<<((ostream *)&std::cerr,"  Illegal value of ORDER = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,n);
    std::operator<<(poVar3,"\n");
    std::operator<<((ostream *)&std::cerr,"  ORDER must be at least 1.\n");
    exit(1);
  }
  dVar7 = r8_epsilon();
  for (iterate_max = 0; iterate_max < n; iterate_max = iterate_max + 1) {
    dVar8 = cos(((double)iterate_max * 6.283185307179586) / (double)(n * 2 + -1));
    x[iterate_max] = -dVar8;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(n * (n + 1));
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  j = 0;
  do {
    for (iterate_max = 0; iterate_max < n; iterate_max = iterate_max + 1) {
      *(double *)((long)pvVar5 + (long)iterate_max * 8) = x[iterate_max];
    }
    test = 1.0;
    for (p._0_4_ = 0; (int)p < n + 1; p._0_4_ = (int)p + 1) {
      *(double *)((long)pvVar6 + (long)((int)p * n) * 8) = test;
      test = -test;
    }
    for (iterate_max = 1; iterate_max < n; iterate_max = iterate_max + 1) {
      *(undefined8 *)((long)pvVar6 + (long)iterate_max * 8) = 0x3ff0000000000000;
    }
    for (iterate_max = 1; iterate_max < n; iterate_max = iterate_max + 1) {
      *(double *)((long)pvVar6 + (long)(iterate_max + n) * 8) = x[iterate_max];
    }
    for (p._0_4_ = 2; (int)p <= n; p._0_4_ = (int)p + 1) {
      for (iterate_max = 1; iterate_max < n; iterate_max = iterate_max + 1) {
        *(double *)((long)pvVar6 + (long)(iterate_max + (int)p * n) * 8) =
             ((double)((int)p * 2 + -1) * x[iterate_max] *
              *(double *)((long)pvVar6 + (long)(iterate_max + ((int)p + -1) * n) * 8) +
             (double)(1 - (int)p) *
             *(double *)((long)pvVar6 + (long)(iterate_max + ((int)p + -2) * n) * 8)) /
             (double)(int)p;
      }
    }
    for (iterate_max = 1; iterate_max < n; iterate_max = iterate_max + 1) {
      x[iterate_max] =
           *(double *)((long)pvVar5 + (long)iterate_max * 8) -
           (((1.0 - *(double *)((long)pvVar5 + (long)iterate_max * 8)) / (double)n) *
           (*(double *)((long)pvVar6 + (long)(iterate_max + (n + -1) * n) * 8) +
           *(double *)((long)pvVar6 + (long)(iterate_max + n * n) * 8))) /
           (*(double *)((long)pvVar6 + (long)(iterate_max + (n + -1) * n) * 8) -
           *(double *)((long)pvVar6 + (long)(iterate_max + n * n) * 8));
    }
    tolerance = 0.0;
    for (iterate_max = 0; iterate_max < n; iterate_max = iterate_max + 1) {
      tolerance = r8_max(tolerance,
                         ABS(x[iterate_max] - *(double *)((long)pvVar5 + (long)iterate_max * 8)));
    }
    j = j + 1;
    local_61 = dVar7 * 100.0 < tolerance && j < 0x19;
  } while (local_61);
  *w = 2.0 / (double)(n * n);
  for (iterate_max = 1; iterate_max < n; iterate_max = iterate_max + 1) {
    dVar7 = x[iterate_max];
    dVar8 = pow((double)n * *(double *)((long)pvVar6 + (long)(iterate_max + (n + -1) * n) * 8),2.0);
    w[iterate_max] = (1.0 - dVar7) / dVar8;
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

void radau_compute ( int n, double x[], double w[] )

//****************************************************************************80
//
//  Purpose:
//
//    RADAU_COMPUTE computes a Radau quadrature rule.
//
//  Discussion:
//
//    The Radau rule is distinguished by the fact that the left endpoint
//    (-1) is always an abscissa.
//
//    The integral:
//
//      Integral ( -1 <= X <= 1 ) F(X) dX
//
//    The quadrature rule:
//
//      Sum ( 1 <= I <= NORDER ) WEIGHT(I) * F ( XTAB(I) )
//
//    The quadrature rule will integrate exactly all polynomials up to
//    X^(2*NORDER-2).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    28 August 2007
//
//  Author:
//
//    Original MATLAB version by Greg von Winckel.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Claudio Canuto, Yousuff Hussaini, Alfio Quarteroni, Thomas Zang,
//    Spectral Methods in Fluid Dynamics,
//    Springer, 1993,
//    ISNB13: 978-3540522058,
//    LC: QA377.S676.
//
//    Francis Hildebrand,
//    Section 8.11,
//    Introduction to Numerical Analysis,
//    Dover, 1987,
//    ISBN13: 978-0486653631,
//    LC: QA300.H5.
//
//    Arthur Stroud, Don Secrest,
//    Gaussian Quadrature Formulas,
//    Prentice Hall, 1966,
//    LC: QA299.4G3S7.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996,
//    ISBN: 0-8493-2479-3,
//    LC: QA47.M315.
//
//  Parameters:
//
//    Input, int N, the order.  N must be at least 1.
//
//    Output, double X[N], the abscissas.
//
//    Output, double W[N], the weights.
//
{
  int i;
  int iterate;
  int iterate_max = 25;
  int j;
  double *p;
  const double r8_pi = 3.141592653589793;
  double temp;
  double test;
  double tolerance;
  double *xold;

  if ( n < 1 )
  {
    std::cerr << "\n";
    std::cerr << "RADAU_COMPUTE - Fatal error!\n";
    std::cerr << "  Illegal value of ORDER = " << n << "\n";
    std::cerr << "  ORDER must be at least 1.\n";
    exit ( 1 );
  }

  tolerance = 100.0 * r8_epsilon ( );
//
//  Initial estimate for the abscissas is the Chebyshev-Gauss-Radau nodes.
//
  for ( i = 0; i < n; i++ )
  {
    x[i] = - cos ( 2.0 * r8_pi * double(         i ) 
                               / double( 2 * n - 1 ) );
  }
  xold = new double[n];
  p = new double[n*(n+1)];
  iterate = 0;

  do
  {
    for ( i = 0; i < n; i++ )
    {
      xold[i] = x[i];
    }

    temp = 1.0;
    for ( j = 0; j < n + 1; j++ )
    {
      p[0+j*n] = temp;
      temp = -temp;
    }

    for ( i = 1; i < n; i++ )
    {
      p[i+0*n] = 1.0;
    }
    for ( i = 1; i < n; i++ )
    {
      p[i+1*n] = x[i];
    }

    for ( j = 2; j <= n; j++ )
    {
      for ( i = 1; i < n; i++ )
      {
        p[i+j*n] = ( double( 2 * j - 1 ) * x[i] * p[i+(j-1)*n]     
                   + double(   - j + 1 ) *        p[i+(j-2)*n] ) 
                   / double(     j     );
      }
    }
    for ( i = 1; i < n; i++ )
    {
      x[i] = xold[i] - ( ( 1.0 - xold[i] ) / double( n ) ) 
        * ( p[i+(n-1)*n] + p[i+n*n] ) / ( p[i+(n-1)*n] - p[i+n*n] );
    }
    test = 0.0;
    for ( i = 0; i < n; i++ )
    {
      test = r8_max ( test, fabs ( x[i] - xold[i] ) );
    }
    iterate = iterate + 1;
  } while ( tolerance < test && iterate < iterate_max );

  w[0] = 2.0 / double( n * n );
  for ( i = 1; i < n; i++ )
  {
    w[i] = ( 1.0 - x[i] ) / pow ( double( n ) * p[i+(n-1)*n], 2 );
  }
  delete [] xold;
  delete [] p;

  return;
}